

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end_to_end_ssim_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_11879c7::EndToEndSSIMTest::CalculateFrameLevelSSIM
          (EndToEndSSIMTest *this,aom_image_t *img_src,aom_image_t *img_enc,
          aom_bit_depth_t bit_depth,uint input_bit_depth)

{
  char cVar1;
  int in_ECX;
  long in_RSI;
  long in_RDI;
  char in_R8B;
  double dVar2;
  int is_uv_1;
  int i_1;
  int is_uv;
  int i;
  uint8_t shift;
  uint8_t is_hbd;
  int crop_heights [2];
  int crop_widths [2];
  double plane_ssim [3];
  double frame_ssim;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar3;
  undefined2 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 uVar4;
  uint32_t bd;
  uint32_t in_stack_ffffffffffffffb8;
  undefined4 uStack_44;
  double local_40;
  double local_38;
  
  memset(&stack0xffffffffffffffb8,0,0x18);
  bd = *(uint32_t *)(in_RSI + 0x28);
  *(int *)(in_RDI + 0x414) = *(int *)(in_RDI + 0x414) + 1;
  uVar4 = 8 < in_ECX;
  if ((bool)uVar4) {
    cVar1 = (char)in_ECX - in_R8B;
    for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
      dVar2 = aom_highbd_ssim2((uint8_t *)
                               CONCAT17(uVar4,CONCAT16(cVar1,CONCAT24(in_stack_ffffffffffffffa4,
                                                                      iVar3))),
                               (uint8_t *)(ulong)CONCAT14(0 < iVar3,in_stack_ffffffffffffff98),
                               in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                               (int)((ulong)in_RDI >> 0x20),(int)in_RDI,bd,in_stack_ffffffffffffffb8
                              );
      *(double *)(&stack0xffffffffffffffb8 + (long)iVar3 * 8) = dVar2;
    }
    *(double *)(in_RDI + 0x418) =
         (double)CONCAT44(uStack_44,in_stack_ffffffffffffffb8) * 0.8 + (local_40 + local_38) * 0.1 +
         *(double *)(in_RDI + 0x418);
  }
  else {
    for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
      dVar2 = aom_ssim2((uint8_t *)
                        CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffa6,
                                                CONCAT24(in_stack_ffffffffffffffa4,
                                                         in_stack_ffffffffffffffa0))),
                        (uint8_t *)CONCAT44(in_stack_ffffffffffffff9c,iVar3),(uint)(0 < iVar3),
                        in_stack_ffffffffffffff90,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      *(double *)(&stack0xffffffffffffffb8 + (long)iVar3 * 8) = dVar2;
    }
    *(double *)(in_RDI + 0x418) =
         (double)CONCAT44(uStack_44,in_stack_ffffffffffffffb8) * 0.8 + (local_40 + local_38) * 0.1 +
         *(double *)(in_RDI + 0x418);
  }
  return;
}

Assistant:

void CalculateFrameLevelSSIM(const aom_image_t *img_src,
                               const aom_image_t *img_enc,
                               aom_bit_depth_t bit_depth,
                               unsigned int input_bit_depth) override {
    double frame_ssim;
    double plane_ssim[MAX_MB_PLANE] = { 0.0, 0.0, 0.0 };
    int crop_widths[PLANE_TYPES];
    int crop_heights[PLANE_TYPES];
    crop_widths[PLANE_TYPE_Y] = img_src->d_w;
    crop_heights[PLANE_TYPE_Y] = img_src->d_h;
    // Width of UV planes calculated based on chroma_shift values.
    crop_widths[PLANE_TYPE_UV] =
        img_src->x_chroma_shift == 1 ? (img_src->w + 1) >> 1 : img_src->w;
    crop_heights[PLANE_TYPE_UV] =
        img_src->y_chroma_shift == 1 ? (img_src->h + 1) >> 1 : img_src->h;
    nframes_++;

#if CONFIG_AV1_HIGHBITDEPTH
    uint8_t is_hbd = bit_depth > AOM_BITS_8;
    if (is_hbd) {
      // HBD ssim calculation.
      uint8_t shift = bit_depth - input_bit_depth;
      for (int i = AOM_PLANE_Y; i < MAX_MB_PLANE; ++i) {
        const int is_uv = i > AOM_PLANE_Y;
        plane_ssim[i] = aom_highbd_ssim2(
            CONVERT_TO_BYTEPTR(img_src->planes[i]),
            CONVERT_TO_BYTEPTR(img_enc->planes[i]),
            img_src->stride[is_uv] >> is_hbd, img_enc->stride[is_uv] >> is_hbd,
            crop_widths[is_uv], crop_heights[is_uv], input_bit_depth, shift);
      }
      frame_ssim = plane_ssim[AOM_PLANE_Y] * .8 +
                   .1 * (plane_ssim[AOM_PLANE_U] + plane_ssim[AOM_PLANE_V]);
      // Accumulate to find sequence level ssim value.
      ssim_ += frame_ssim;
      return;
    }
#else
    (void)bit_depth;
    (void)input_bit_depth;
#endif  // CONFIG_AV1_HIGHBITDEPTH

    // LBD ssim calculation.
    for (int i = AOM_PLANE_Y; i < MAX_MB_PLANE; ++i) {
      const int is_uv = i > AOM_PLANE_Y;
      plane_ssim[i] = aom_ssim2(img_src->planes[i], img_enc->planes[i],
                                img_src->stride[is_uv], img_enc->stride[is_uv],
                                crop_widths[is_uv], crop_heights[is_uv]);
    }
    frame_ssim = plane_ssim[AOM_PLANE_Y] * .8 +
                 .1 * (plane_ssim[AOM_PLANE_U] + plane_ssim[AOM_PLANE_V]);
    // Accumulate to find sequence level ssim value.
    ssim_ += frame_ssim;
  }